

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramInfoLogCase::test(ProgramInfoLogCase *this)

{
  GLuint shader;
  GLuint shader_00;
  GLuint program_00;
  int iVar1;
  qpTestResult qVar2;
  int *piVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  CallLogWrapper *this_00;
  char *local_2128;
  char *local_2120;
  MessageBuilder local_2110;
  GLsizei local_1f8c;
  GLchar local_1f88 [4];
  GLint written_2;
  char buffer_2 [2048];
  allocator<char> local_1779;
  string local_1778;
  allocator<char> local_1751;
  string local_1750;
  ScopedLogSection local_1730;
  ScopedLogSection section_2;
  int local_15a4;
  MessageBuilder local_15a0;
  GLsizei local_141c;
  GLchar local_1418 [4];
  GLint written_1;
  char buffer_1 [2048];
  allocator<char> local_c09;
  string local_c08;
  allocator<char> local_be1;
  string local_be0;
  ScopedLogSection local_bc0;
  ScopedLogSection section_1;
  int local_a34;
  MessageBuilder local_a30;
  GLsizei local_8ac;
  GLchar local_8a8 [4];
  GLint written;
  char buffer [2048];
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  ScopedLogSection local_40;
  ScopedLogSection section;
  StateQueryMemoryWriteGuard<int> logLength;
  GLuint program;
  GLuint shaderFrag;
  GLuint shaderVert;
  char *frgSource;
  char *vtxSource;
  ProgramInfoLogCase *this_local;
  
  if (this->m_buildErrorType == BUILDERROR_COMPILE) {
    local_2120 = Functional::(anonymous_namespace)::brokenShader;
  }
  else {
    local_2120 = 
    "#version 300 es\nin highp vec4 a_pos;\nuniform highp vec4 u_uniform;\nvoid main ()\n{\n\tgl_Position = a_pos + u_uniform;\n}\n"
    ;
  }
  frgSource = local_2120;
  if (this->m_buildErrorType == BUILDERROR_COMPILE) {
    local_2128 = Functional::(anonymous_namespace)::brokenShader;
  }
  else {
    local_2128 = 
    "#version 300 es\nin highp vec4 v_missingVar;\nuniform highp int u_uniform;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main ()\n{\n\tfragColor = v_missingVar + vec4(float(u_uniform));\n}\n"
    ;
  }
  _shaderFrag = local_2128;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  vtxSource = (char *)this;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&frgSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,(GLchar **)&shaderFrag,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program_00 = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program_00,shader);
  glu::CallLogWrapper::glAttachShader(this_00,program_00,shader_00);
  glu::CallLogWrapper::glLinkProgram(this_00,program_00);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)&section);
  piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)&section);
  glu::CallLogWrapper::glGetProgramiv(this_00,program_00,0x8b84,piVar3);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            ((StateQueryMemoryWriteGuard<int> *)&section,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"QueryLarge",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Query to large buffer",&local_99);
  tcu::ScopedLogSection::ScopedLogSection(&local_40,pTVar4,&local_60,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  memset(local_8a8,0,0x800);
  local_8a8[0] = 'x';
  local_8ac = 0;
  glu::CallLogWrapper::glGetProgramInfoLog
            (&(this->super_ApiCase).super_CallLogWrapper,program_00,0x800,&local_8ac,local_8a8);
  piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                     ((StateQueryMemoryWriteGuard *)&section);
  if ((*piVar3 == 0) ||
     (iVar1 = local_8ac + 1,
     piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                        ((StateQueryMemoryWriteGuard *)&section), iVar1 == *piVar3)) {
    piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)&section);
    if ((*piVar3 != 0) && (local_8a8[local_8ac] != '\0')) {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&section_1,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&section_1,
                          (char (*) [45])"// ERROR: Expected null terminator at index ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_8ac);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_1);
      qVar2 = tcu::TestContext::getTestResult
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult
                  ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"missing null terminator");
      }
    }
  }
  else {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_a30,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_a30,(char (*) [36])"// ERROR: Expected INFO_LOG_LENGTH ");
    local_a34 = local_8ac + 1;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_a34);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2b7cef6);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(StateQueryMemoryWriteGuard<int> *)&section);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a30);
    qVar2 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got invalid log length");
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_40);
  piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                     ((StateQueryMemoryWriteGuard *)&section);
  if (*piVar3 < 0x800) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_be0,"QueryAll",&local_be1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c08,"Query all to exactly right sized buffer",&local_c09);
    tcu::ScopedLogSection::ScopedLogSection(&local_bc0,pTVar4,&local_be0,&local_c08);
    std::__cxx11::string::~string((string *)&local_c08);
    std::allocator<char>::~allocator(&local_c09);
    std::__cxx11::string::~string((string *)&local_be0);
    std::allocator<char>::~allocator(&local_be1);
    memset(local_1418,0,0x800);
    local_1418[0] = 'x';
    local_141c = 0;
    piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)&section);
    glu::CallLogWrapper::glGetProgramInfoLog
              (&(this->super_ApiCase).super_CallLogWrapper,program_00,*piVar3,&local_141c,local_1418
              );
    piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)&section);
    if ((*piVar3 == 0) ||
       (iVar1 = local_141c + 1,
       piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                          ((StateQueryMemoryWriteGuard *)&section), iVar1 == *piVar3)) {
      piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)&section);
      if ((*piVar3 != 0) && (local_1418[local_141c] != '\0')) {
        pTVar4 = tcu::TestContext::getLog
                           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                            m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&section_2,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&section_2,
                            (char (*) [45])"// ERROR: Expected null terminator at index ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_141c);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_2);
        qVar2 = tcu::TestContext::getTestResult
                          ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
        if (qVar2 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult
                    ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"missing null terminator");
        }
      }
    }
    else {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<(&local_15a0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_15a0,(char (*) [36])"// ERROR: Expected INFO_LOG_LENGTH ");
      local_15a4 = local_141c + 1;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_15a4);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2b7cef6);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(StateQueryMemoryWriteGuard<int> *)&section);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_15a0);
      qVar2 = tcu::TestContext::getTestResult
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult
                  ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"got invalid log length");
      }
    }
    tcu::ScopedLogSection::~ScopedLogSection(&local_bc0);
  }
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1750,"QueryNone",&local_1751);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1778,"Query none",&local_1779)
  ;
  tcu::ScopedLogSection::ScopedLogSection(&local_1730,pTVar4,&local_1750,&local_1778);
  std::__cxx11::string::~string((string *)&local_1778);
  std::allocator<char>::~allocator(&local_1779);
  std::__cxx11::string::~string((string *)&local_1750);
  std::allocator<char>::~allocator(&local_1751);
  memset(local_1f88,0,0x800);
  local_1f88[0] = 'x';
  local_1f8c = 0;
  glu::CallLogWrapper::glGetProgramInfoLog
            (&(this->super_ApiCase).super_CallLogWrapper,program_00,1,&local_1f8c,local_1f88);
  if (local_1f8c != 0) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                       );
    tcu::TestLog::operator<<(&local_2110,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_2110,(char (*) [40])"// ERROR: Expected write length 0; got ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1f8c);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2110);
    qVar2 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got invalid log length");
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1730);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader_00);
  glu::CallLogWrapper::glDeleteProgram(&(this->super_ApiCase).super_CallLogWrapper,program_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		enum
		{
			BUF_SIZE = 2048
		};

		static const char* const linkErrorVtxSource = "#version 300 es\n"
													  "in highp vec4 a_pos;\n"
													  "uniform highp vec4 u_uniform;\n"
													  "void main ()\n"
													  "{\n"
													  "	gl_Position = a_pos + u_uniform;\n"
													  "}\n";
		static const char* const linkErrorFrgSource = "#version 300 es\n"
													  "in highp vec4 v_missingVar;\n"
													  "uniform highp int u_uniform;\n"
													  "layout(location = 0) out mediump vec4 fragColor;\n"
													  "void main ()\n"
													  "{\n"
													  "	fragColor = v_missingVar + vec4(float(u_uniform));\n"
													  "}\n";

		const char* vtxSource = (m_buildErrorType == BUILDERROR_COMPILE) ? (brokenShader) : (linkErrorVtxSource);
		const char* frgSource = (m_buildErrorType == BUILDERROR_COMPILE) ? (brokenShader) : (linkErrorFrgSource);

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &vtxSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &frgSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);

		StateQueryMemoryWriteGuard<GLint> logLength;
		glGetProgramiv(program, GL_INFO_LOG_LENGTH, &logLength);
		logLength.verifyValidity(m_testCtx);

		// check INFO_LOG_LENGTH == GetProgramInfoLog len
		{
			const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "QueryLarge", "Query to large buffer");
			char						buffer[BUF_SIZE]	= {'x'};
			GLint						written				= 0;

			glGetProgramInfoLog(program, BUF_SIZE, &written, buffer);

			if (logLength != 0 && written+1 != logLength) // INFO_LOG_LENGTH contains 0-terminator
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected INFO_LOG_LENGTH " << written+1 << "; got " << logLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
			else if (logLength != 0 && buffer[written] != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator at index " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing null terminator");
			}
		}

		// check query to just correct sized buffer
		if (BUF_SIZE > logLength)
		{
			const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "QueryAll", "Query all to exactly right sized buffer");
			char						buffer[BUF_SIZE]	= {'x'};
			GLint						written				= 0;

			glGetProgramInfoLog(program, logLength, &written, buffer);

			if (logLength != 0 && written+1 != logLength) // INFO_LOG_LENGTH contains 0-terminator
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected INFO_LOG_LENGTH " << written+1 << "; got " << logLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
			else if (logLength != 0 && buffer[written] != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator at index " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing null terminator");
			}
		}

		// check GetProgramInfoLog works with too small buffer
		{
			const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "QueryNone", "Query none");
			char						buffer[BUF_SIZE]	= {'x'};
			GLint						written				= 0;

			glGetProgramInfoLog(program, 1, &written, buffer);

			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected write length 0; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}